

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.cpp
# Opt level: O0

void __thiscall TPZStream::Read(TPZStream *this,string *p,int howMany)

{
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  int stringSize;
  int c;
  char *temp;
  int local_28;
  int local_24;
  char *local_20;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  for (local_24 = 0; local_24 < local_14; local_24 = local_24 + 1) {
    std::__cxx11::string::clear();
    local_28 = -1;
    (**(code **)(*in_RDI + 0xe8))(in_RDI,&local_28,1);
    local_20 = (char *)operator_new__((long)(local_28 + 1));
    (**(code **)(*in_RDI + 0x128))(in_RDI,local_20,local_28);
    local_20[local_28] = '\0';
    std::__cxx11::string::operator=((string *)(local_10 + (long)local_24 * 0x20),local_20);
    if (local_20 != (char *)0x0) {
      operator_delete(local_20,1);
    }
  }
  return;
}

Assistant:

void TPZStream::Read(std::string *p, int howMany) {
    char *temp;
    for (int c = 0; c < howMany; c++) {
        p[c].clear();
        int stringSize = -1;
        Read(&stringSize, 1);
        temp = new char[stringSize+1];
        Read(temp, stringSize);
        temp[stringSize] = 0;
        p[c] = temp;
        delete temp;
    }
}